

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

CatalogEntryInfo *
duckdb::DependencyManager::GetLookupProperties
          (CatalogEntryInfo *__return_storage_ptr__,CatalogEntry *entry)

{
  int iVar1;
  undefined4 extraout_var;
  CatalogEntry *in_RDX;
  DependencyEntry *dependency_entry;
  string schema;
  string local_40;
  
  if (entry->type == DEPENDENCY_ENTRY) {
    iVar1 = (*entry->_vptr_CatalogEntry[0x10])(entry);
    CatalogEntryInfo::CatalogEntryInfo
              (__return_storage_ptr__,(CatalogEntryInfo *)CONCAT44(extraout_var,iVar1));
  }
  else {
    GetSchema_abi_cxx11_(&local_40,(DependencyManager *)entry,in_RDX);
    __return_storage_ptr__->type = entry->type;
    ::std::__cxx11::string::string((string *)&__return_storage_ptr__->schema,(string *)&local_40);
    ::std::__cxx11::string::string((string *)&__return_storage_ptr__->name,(string *)&entry->name);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

CatalogEntryInfo DependencyManager::GetLookupProperties(const CatalogEntry &entry) {
	if (entry.type == CatalogType::DEPENDENCY_ENTRY) {
		auto &dependency_entry = entry.Cast<DependencyEntry>();
		return dependency_entry.EntryInfo();
	} else {
		auto schema = DependencyManager::GetSchema(entry);
		auto &name = entry.name;
		auto &type = entry.type;
		return CatalogEntryInfo {type, schema, name};
	}
}